

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,TasmanianSparseGrid *this,
          TypeDepth type,int output)

{
  int output_local;
  TypeDepth type_local;
  TasmanianSparseGrid *this_local;
  vector<int,_std::allocator<int>_> *w;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
            ((TypeDepth)this,type,(vector *)(ulong)(uint)output);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> estimateAnisotropicCoefficients(TypeDepth type, int output) const{ std::vector<int> w; estimateAnisotropicCoefficients(type, output, w); return w; }